

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.c
# Opt level: O0

void showmem(void)

{
  undefined1 local_98 [8];
  rusage rusage;
  
  memset(local_98,0,0x90);
  getrusage(RUSAGE_SELF,(rusage *)local_98);
  fprintf(_stderr,"maxrss: %ld KB\n",rusage.ru_stime.tv_usec);
  return;
}

Assistant:

static void showmem(void)
{
#ifdef HAVE_GETRUSAGE
	struct rusage rusage;
	memset(&rusage, 0, sizeof(rusage));
	getrusage(RUSAGE_SELF, &rusage);
	fprintf(stderr, "maxrss: %ld KB\n", rusage.ru_maxrss);
#endif
}